

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O1

void __thiscall Logger::LogError(Logger *this,string *stringForLogError)

{
  pointer pcVar1;
  ostream *poVar2;
  ofstream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (this->loggerPath)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (this->loggerPath)._M_string_length);
  std::__cxx11::string::append((char *)local_40);
  poVar3 = &this->loggerFile;
  std::ofstream::open((string *)poVar3,(_Ios_Openmode)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"--ERROR--",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar3,(stringForLogError->_M_dataplus)._M_p,
                      stringForLogError->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ofstream::close();
  return;
}

Assistant:

void LogError(string stringForLogError) {
        loggerFile.open(this->loggerPath + "/errors", ios_base::app);
        loggerFile << "--ERROR--" << " " << stringForLogError << endl;
        loggerFile.close();
    }